

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O0

void __thiscall puppup::Game::checkWinner(Game *this)

{
  long lVar1;
  const_reference pvVar2;
  reference this_00;
  reference pvVar3;
  size_type local_18;
  chr i;
  Game *this_local;
  
  for (local_18 = 0; (long)local_18 < 0x1b; local_18 = local_18 + 1) {
    pvVar2 = std::array<long,_32UL>::operator[]((array<long,_32UL> *)scores,local_18);
    lVar1 = *pvVar2;
    this_00 = std::array<std::array<long,_32UL>,_2UL>::operator[](&this->racks_,this->turn_ ^ 1);
    pvVar3 = std::array<long,_32UL>::operator[](this_00,local_18);
    (this->state_).score = lVar1 * *pvVar3 + (this->state_).score;
  }
  if ((this->state_).score < 1) {
    if ((this->state_).score < 0) {
      this->winner_ = this->turn_ ^ 1;
    }
    else {
      this->winner_ = 2;
    }
  }
  else {
    this->winner_ = this->turn_;
  }
  return;
}

Assistant:

void checkWinner() {
        for (chr i = 0; i < 27; ++i) {
            state_.score += scores[i] * racks_[turn_ ^ 1][i];
        }
        // print(racks_[turn_]);
        // print(racks_[turn_ ^ 1]);
        // std::cerr << state_.score << std::endl;
        if (state_.score > 0) {
            winner_ = turn_;
        } else if (state_.score < 0) {
            winner_ = turn_ ^ 1;
        } else {
            winner_ = 2;
        }
    }